

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# movegen.h
# Opt level: O2

Move * puppup::movegen::moveCommand
                 (Move *__return_storage_ptr__,idx step,idx cursor,string *word_s,State *state,
                 Gaddag *gaddag)

{
  byte bVar1;
  long lVar2;
  bool bVar3;
  ostream *poVar4;
  idx iVar5;
  long lVar6;
  long lVar7;
  long cursor_00;
  long lVar8;
  long lVar9;
  long lVar10;
  byte *pbVar11;
  bool bVar12;
  byte *pbVar13;
  long *plVar14;
  ulong local_d0;
  long local_c8;
  long local_c0;
  long local_b8;
  long local_90;
  long local_78;
  
  pbVar11 = (byte *)(word_s->_M_dataplus)._M_p;
  local_c8 = (((gaddag->nodes_).
               super__Vector_base<puppup::trie::Gaddag::Node,_std::allocator<puppup::trie::Gaddag::Node>_>
               ._M_impl.super__Vector_impl_data._M_start)->children)._M_elems[0x1f];
  pbVar13 = pbVar11 + word_s->_M_string_length;
  lVar9 = 0;
  local_b8 = 1;
  local_90 = 0;
  local_c0 = 0;
  local_d0 = 0;
  for (; pbVar11 != pbVar13; pbVar11 = pbVar11 + 1) {
    bVar1 = *pbVar11;
    if ((byte)(bVar1 + 0x9f) < 0x1a) {
      lVar6 = *(long *)(stridx + (ulong)bVar1 * 8);
      lVar7 = lVar6;
    }
    else if ((byte)(bVar1 + 0xbf) < 0x1a) {
      lVar6 = *(long *)(stridx + (ulong)bVar1 * 8 + 0x100);
      local_d0 = local_d0 << 0x10 | cursor + 1U;
      lVar7 = 0x1a;
    }
    else {
      poVar4 = std::operator<<((ostream *)&std::cerr,"unexpected character! ");
      poVar4 = std::operator<<(poVar4,bVar1);
      std::endl<char,std::char_traits<char>>(poVar4);
      lVar6 = 0x1a;
      lVar7 = lVar6;
    }
    if (local_c8 == -1) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"move command contains illegal word! ");
      poVar4 = std::operator<<(poVar4,(string *)word_s);
      std::endl<char,std::char_traits<char>>(poVar4);
      local_c8 = -1;
    }
    else {
      local_c8 = (gaddag->nodes_).
                 super__Vector_base<puppup::trie::Gaddag::Node,_std::allocator<puppup::trie::Gaddag::Node>_>
                 ._M_impl.super__Vector_impl_data._M_start[local_c8].children._M_elems[lVar6];
    }
    if ((state->board)._M_elems[cursor] == 0x1b) {
      lVar10 = 0;
      lVar2 = (&board::letter_multiplier)[cursor];
      lVar6 = (&scores)[lVar7];
      lVar7 = (&board::word_multiplier)[cursor];
      bVar12 = false;
      local_78 = -8;
      for (lVar8 = -1; lVar8 < 2; lVar8 = lVar8 + 2) {
        iVar5 = __impl::turn(step);
        cursor_00 = cursor + iVar5 * lVar8;
        for (plVar14 = (state->letter_score)._M_elems + cursor_00;
            (bVar3 = __impl::edge(cursor_00), !bVar3 && (plVar14[-0x100] != 0x1b));
            plVar14 = (long *)((long)plVar14 + iVar5 * local_78)) {
          lVar10 = lVar10 + *plVar14;
          cursor_00 = cursor_00 + iVar5 * lVar8;
          bVar12 = true;
        }
        local_78 = local_78 + 0x10;
      }
      local_90 = local_90 + 1;
      lVar6 = lVar6 * lVar2;
      local_b8 = local_b8 * lVar7;
      if (bVar12) {
        local_c0 = local_c0 + (lVar10 + lVar6) * lVar7;
      }
    }
    else {
      lVar6 = (state->letter_score)._M_elems[cursor];
    }
    cursor = cursor + step;
    lVar9 = lVar9 + lVar6;
  }
  if (local_c8 == -1) {
    iVar5 = -1;
  }
  else {
    iVar5 = (gaddag->node_to_word_).super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_start[local_c8];
  }
  lVar6 = lVar9 * local_b8 + 0x23;
  if (local_90 < 7) {
    lVar6 = lVar9 * local_b8;
  }
  __return_storage_ptr__->score = lVar6 + local_c0;
  __return_storage_ptr__->word = iVar5;
  __return_storage_ptr__->cursor = cursor;
  __return_storage_ptr__->step = step;
  __return_storage_ptr__->blanks = local_d0;
  return __return_storage_ptr__;
}

Assistant:

inline Move moveCommand(idx step, idx cursor, std::string word_s,
                        const board::State& state, const trie::Gaddag& gaddag) {
    idx blanks = 0;
    idx non_multipliable_score = 0;
    idx multipliable_score = 0;
    idx word_mult = 1;
    trie::nodeid node = gaddag.get(0, trie::rev_marker);
    idx placed = 0;
    for (char c : word_s) {
        chr letter = blank;
        chr actual_letter = blank;
        if (c >= 'a' && c <= 'z') {
            actual_letter = letter = stridx[(idx)c];
        } else if (c >= 'A' && c <= 'Z') {
            letter = stridx[(idx)c + 'a' - 'A'];
            actual_letter = blank;
            blanks <<= idx(16LL);
            blanks |= cursor + 1;
        } else {
            std::cerr << "unexpected character! " << c << std::endl;
        }
        if (node != -1) {
            node = gaddag.get(node, letter);
        } else {
            std::cerr << "move command contains illegal word! " << word_s
                      << std::endl;
        }
        if (state.board[cursor] == emptiness) {
            ++placed;
            multipliable_score +=
                board::letter_multiplier[cursor] * scores[actual_letter];
            word_mult *= board::word_multiplier[cursor];

            idx orth_score = 0;
            bool works = false;
            for (idx o = -1; o <= 1; o += 2) {
                idx ostep = __impl::turn(step) * o;
                for (idx ocursor = cursor + ostep;
                     !__impl::edge(ocursor) &&
                     state.board[ocursor] != emptiness;
                     ocursor += ostep) {
                    orth_score += state.letter_score[ocursor];
                    works = true;
                }
            }

            if (works) {
                orth_score +=
                    board::letter_multiplier[cursor] * scores[actual_letter];
                non_multipliable_score +=
                    orth_score * board::word_multiplier[cursor];
            }
        } else {
            multipliable_score += state.letter_score[cursor];
        }
        cursor += step;
    }
    const idx bingo = placed >= 7 ? bingo_bonus : 0;
    const idx score =
        non_multipliable_score + word_mult * multipliable_score + bingo;
    // std::cerr << "nms: " << non_multipliable_score << std::endl;
    // std::cerr << "ms: " << multipliable_score << std::endl;
    // std::cerr << "mult: " << word_mult << std::endl;
    const idx wordid = node == -1 ? -1 : gaddag.nodeToWord(node);
    return Move{score, wordid, cursor, step, blanks};
}